

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsystem_netconf.c
# Opt level: O3

int netconf_write(LIBSSH2_CHANNEL *channel,char *buf,size_t len)

{
  ulong uVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    uVar1 = libssh2_channel_write_ex(channel,0,buf);
    if ((long)uVar1 < 0) {
      fprintf(_stderr,"libssh2_channel_write: %d\n",uVar1 & 0xffffffff);
      return -1;
    }
    if (uVar1 == 0) break;
    lVar2 = lVar2 + uVar1;
    if ((long)len <= lVar2) {
      return 0;
    }
  }
  return 0;
}

Assistant:

static int netconf_write(LIBSSH2_CHANNEL *channel, const char *buf, size_t len)
{
    ssize_t i;
    ssize_t wr = 0;

    do {
        i = libssh2_channel_write(channel, buf, len);
        if(i < 0) {
            fprintf(stderr, "libssh2_channel_write: %d\n", (int)i);
            return -1;
        }
        wr += i;
    } while(i > 0 && wr < (ssize_t)len);

    return 0;
}